

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITxSender_testfile.cpp
# Opt level: O0

ssize_t __thiscall
ITxSender_testfile::send(ITxSender_testfile *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference puVar4;
  undefined4 in_register_00000034;
  const_iterator cStack_60;
  uchar bit_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_1;
  const_iterator cStack_40;
  uchar bit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *signal_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *signalHeader_local;
  ITxSender_testfile *this_local;
  
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 3400");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"space 1725");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_register_00000034,__fd));
    cStack_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_register_00000034,__fd));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end1);
      if (*puVar4 == '\0') {
        poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 470");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"space 400");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 470");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"space 1200");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end1);
    }
    poVar3 = std::operator<<((ostream *)&this->m_file,"timeout 13400");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 3400");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"space 1725");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end1_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__buf);
    cStack_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__buf);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffa0);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end1_1);
      if (*puVar4 == '\0') {
        poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 470");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"space 400");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 470");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"space 1200");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end1_1);
    }
    poVar3 = std::operator<<((ostream *)&this->m_file,"pulse 470");
    uVar2 = std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 1;
  }
  return CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool ITxSender_testfile::send(const std::vector<uint8_t> &signalHeader
	, const std::vector<uint8_t> &signal)
{
	if (!m_file.is_open()) {
		return false;
	}

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Header
	for (auto bit : signalHeader) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		} else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	m_file << "timeout 13400" << std::endl;

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Message
	for (auto bit : signal) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		}
		else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	// End pulse
	m_file << "pulse 470" << std::endl;
	return true;
}